

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t *
Acb_FindSupportNext(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Wrd_t *vPats,int *pnPats)

{
  uint uVar1;
  word *pwVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *extraout_RDX;
  Vec_Int_t *extraout_RDX_00;
  Vec_Int_t *vWeights_00;
  Vec_Int_t *extraout_RDX_01;
  word Mask [64];
  Vec_Int_t *local_250;
  word local_238 [65];
  
  uVar1 = vWeights->nSize;
  local_250 = (Vec_Int_t *)malloc(0x10);
  local_250->nCap = 100;
  local_250->nSize = 0;
  piVar4 = (int *)malloc(400);
  local_250->pArray = piVar4;
  memset(local_238,0xff,0x200);
  vWeights_00 = extraout_RDX;
  while( true ) {
    iVar3 = Acb_FindArgMaxUnderMask(vPats,local_238,vWeights_00,*pnPats);
    if (iVar3 + iFirstDiv < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(local_250,(iVar3 + iFirstDiv) * 2 + 1);
    if ((iVar3 < 0) || (vPats->nSize <= iVar3 * 0x40)) break;
    pwVar2 = vPats->pArray;
    lVar6 = 0;
    do {
      local_238[lVar6] = local_238[lVar6] & ~pwVar2[(ulong)(uint)(iVar3 * 0x40) + lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x40);
    iVar3 = sat_solver_solve(pSat,local_250->pArray,local_250->pArray + local_250->nSize,0,0,0,0);
    iVar5 = 3;
    vWeights_00 = extraout_RDX_00;
    if (iVar3 != -1) {
      if (iVar3 != 1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                      ,0x3c9,
                      "Vec_Int_t *Acb_FindSupportNext(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int *)"
                     );
      }
      if (0 < (int)uVar1) {
        lVar6 = 0;
        vWeights_00 = (Vec_Int_t *)(ulong)(uint)iFirstDiv;
        do {
          if ((iFirstDiv < 0) || (pSat->size <= (int)vWeights_00)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (pSat->model[(long)vWeights_00] == 1) {
            if (vPats->nSize <= lVar6) goto LAB_0036fc5d;
            vPats->pArray[(*pnPats >> 6) + lVar6] =
                 vPats->pArray[(*pnPats >> 6) + lVar6] | 1L << ((byte)*pnPats & 0x3f);
          }
          vWeights_00 = (Vec_Int_t *)((long)&vWeights_00->nCap + 1);
          lVar6 = lVar6 + 0x40;
        } while ((ulong)uVar1 << 6 != lVar6);
      }
      iVar3 = *pnPats;
      iVar5 = iVar3 + 1;
      *pnPats = iVar5;
      if (iVar5 == 0x1000) {
        iVar5 = 1;
        if (local_250 != (Vec_Int_t *)0x0) {
          if (local_250->pArray != (int *)0x0) {
            free(local_250->pArray);
            local_250->pArray = (int *)0x0;
          }
          free(local_250);
          local_250 = (Vec_Int_t *)0x0;
          vWeights_00 = extraout_RDX_01;
        }
      }
      else {
        iVar5 = 0;
        if (0xffe < iVar3) {
          __assert_fail("*pnPats < NWORDS*64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                        ,0x3d7,
                        "Vec_Int_t *Acb_FindSupportNext(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int *)"
                       );
        }
      }
    }
    if (iVar5 != 0) {
      if (iVar5 == 3) {
        qsort(local_250->pArray,(long)local_250->nSize,4,Vec_IntSortCompare1);
      }
      else {
        local_250 = (Vec_Int_t *)0x0;
      }
      return local_250;
    }
  }
LAB_0036fc5d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

Vec_Int_t * Acb_FindSupportNext( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Wrd_t * vPats, int * pnPats )
{
    int i, status, nDivs = Vec_IntSize(vWeights);
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    word * pMask, Mask[NWORDS]; Abc_TtConst( Mask, NWORDS, 1 );
    while ( 1 )
    {
        int iDivBest = Acb_FindArgMaxUnderMask( vPats, Mask, vWeights, *pnPats ); 
        Vec_IntPush( vSupp, Abc_Var2Lit(iFirstDiv+iDivBest, 1) );
        //printf( "Selecting divisor %d with weight %d\n", iDivBest, Vec_IntEntry(vWeights, iDivBest) );
//        Mask &= ~Vec_WrdEntry( vPats, iDivBest );
        pMask = Vec_WrdEntryP( vPats, NWORDS*iDivBest );
        Abc_TtAndSharp( Mask, Mask, pMask, NWORDS, 1 );

        // try one run
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status == l_False )
            break;
        assert( status == l_True );
        // collect pattern
        for ( i = 0; i < nDivs; i++ )
        {
            if ( sat_solver_var_value(pSat, iFirstDiv+i) == 0 )
                continue;
            Abc_TtSetBit( Vec_WrdEntryP(vPats, NWORDS*i), *pnPats );
        }
        (*pnPats)++;
        if ( *pnPats == NWORDS*64 )
        {
            Vec_IntFreeP( &vSupp );
            return NULL;
        }
        assert( *pnPats < NWORDS*64 );
        //Acb_PrintPatterns( vPats, *pnPats, vWeights );
        //i = i;
    }
    Vec_IntSort( vSupp, 0 );
    return vSupp;
}